

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

int Parser_isNameChar(int c,int bNameChar)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Parser_isCharInTable(c,Letter,0xcf);
  iVar2 = 1;
  if (iVar1 == 0) {
    if ((bNameChar != 0) && (iVar2 = Parser_isCharInTable(c,NameChar,0x7b), iVar2 != 0)) {
      return 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int Parser_isNameChar(
	/*! [in] The character to check. */
	int c,
	/*! [in] 1 if you also want to check in the NameChar table. */
	int bNameChar)
{
	if (Parser_isCharInTable(c, Letter, (int)LETTERTABLESIZE)) {
		return 1;
	}

	if (bNameChar &&
		Parser_isCharInTable(c, NameChar, (int)NAMECHARTABLESIZE)) {
		return 1;
	}

	return 0;
}